

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

SystemTimingCheckSymbol *
slang::ast::SystemTimingCheckSymbol::fromSyntax(Scope *parent,SystemTimingCheckSyntax *syntax)

{
  char *pcVar1;
  Compilation *this;
  uint uVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t __n;
  char *__s1;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  SystemTimingCheckSymbol *pSVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  size_type __rlen;
  long lVar18;
  undefined1 auVar19 [16];
  size_t pos;
  value_type *elements;
  SourceLocation local_60;
  string_view local_58;
  SystemTimingCheckDef *local_48;
  Token local_40;
  
  local_58 = parsing::Token::valueText(&syntax->name);
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &SystemTimingCheckDefs,&local_58);
  lVar10 = DAT_005ca938;
  lVar9 = DAT_005ca930;
  uVar8 = DAT_005ca928;
  uVar15 = uVar13 >> (SystemTimingCheckDefs & 0x3f);
  lVar16 = (uVar13 & 0xff) * 4;
  cVar4 = (&UNK_00461acc)[lVar16];
  cVar5 = (&UNK_00461acd)[lVar16];
  cVar6 = (&UNK_00461ace)[lVar16];
  bVar7 = (&UNK_00461acf)[lVar16];
  __n = local_58._M_len;
  __s1 = local_58._M_str;
  uVar17 = 0;
  do {
    pcVar1 = (char *)(lVar9 + uVar15 * 0x10);
    bVar3 = pcVar1[0xf];
    auVar19[0] = -(*pcVar1 == cVar4);
    auVar19[1] = -(pcVar1[1] == cVar5);
    auVar19[2] = -(pcVar1[2] == cVar6);
    auVar19[3] = -(pcVar1[3] == bVar7);
    auVar19[4] = -(pcVar1[4] == cVar4);
    auVar19[5] = -(pcVar1[5] == cVar5);
    auVar19[6] = -(pcVar1[6] == cVar6);
    auVar19[7] = -(pcVar1[7] == bVar7);
    auVar19[8] = -(pcVar1[8] == cVar4);
    auVar19[9] = -(pcVar1[9] == cVar5);
    auVar19[10] = -(pcVar1[10] == cVar6);
    auVar19[0xb] = -(pcVar1[0xb] == bVar7);
    auVar19[0xc] = -(pcVar1[0xc] == cVar4);
    auVar19[0xd] = -(pcVar1[0xd] == cVar5);
    auVar19[0xe] = -(pcVar1[0xe] == cVar6);
    auVar19[0xf] = -(bVar3 == bVar7);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar16 = lVar10 + uVar15 * 0x348;
      do {
        uVar2 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        lVar18 = (ulong)uVar2 * 0x38;
        if (__n == *(size_t *)(lVar16 + lVar18)) {
          if (__n != 0) {
            iVar11 = bcmp(__s1,*(void **)(lVar16 + 8 + lVar18),__n);
            if (iVar11 != 0) goto LAB_00401230;
          }
          local_48 = (SystemTimingCheckDef *)(lVar16 + lVar18 + 0x10);
          goto LAB_0040129f;
        }
LAB_00401230:
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar3) == 0) break;
    lVar16 = uVar15 + uVar17;
    uVar17 = uVar17 + 1;
    uVar15 = lVar16 + 1U & uVar8;
  } while (uVar17 <= uVar8);
  fromSyntax();
  local_48 = (SystemTimingCheckDef *)0x0;
LAB_0040129f:
  this = parent->compilation;
  local_40 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
  local_60 = parsing::Token::location(&local_40);
  pSVar14 = BumpAllocator::
            emplace<slang::ast::SystemTimingCheckSymbol,slang::SourceLocation,slang::ast::SystemTimingCheckDef_const*&>
                      (&this->super_BumpAllocator,&local_60,&local_48);
  (pSVar14->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  return pSVar14;
}

Assistant:

SystemTimingCheckSymbol& SystemTimingCheckSymbol::fromSyntax(
    const Scope& parent, const SystemTimingCheckSyntax& syntax) {

    const SystemTimingCheckDef* def;
    if (auto it = SystemTimingCheckDefs.find(syntax.name.valueText());
        it != SystemTimingCheckDefs.end()) {
        def = &it->second;
    }
    else {
        parent.addDiag(diag::UnknownSystemTimingCheck, syntax.name.range())
            << syntax.name.valueText();
        def = nullptr;
    }

    auto& comp = parent.getCompilation();
    auto result = comp.emplace<SystemTimingCheckSymbol>(syntax.getFirstToken().location(), def);
    result->setSyntax(syntax);
    return *result;
}